

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void Cmd_invnext(FCommandLine *argv,APlayerPawn *who,int key)

{
  FFont *font;
  DBaseStatusBar *this;
  bool bVar1;
  uint uVar2;
  EColorRange textColor;
  AInventory *pAVar3;
  DHUDMessageFadeOut *this_00;
  AInventory *pAVar4;
  char *text;
  AInventory *next;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (who != (APlayerPawn *)0x0) {
    pAVar4 = (AInventory *)0x0;
    bVar1 = TObjPtr<AInventory>::operator!=(&who->InvSel,(AInventory *)0x0);
    if (bVar1) {
      pAVar3 = TObjPtr<AInventory>::operator->(&who->InvSel);
      pAVar3 = AInventory::NextInv(pAVar3);
      if (pAVar3 == (AInventory *)0x0) {
        pAVar3 = TObjPtr<AInventory>::operator->(&(who->super_AActor).Inventory);
        if ((pAVar3->ItemFlags & 0x40) == 0) {
          pAVar4 = TObjPtr<AInventory>::operator->(&(who->super_AActor).Inventory);
          pAVar4 = AInventory::NextInv(pAVar4);
          TObjPtr<AInventory>::operator=(&who->InvSel,pAVar4);
        }
        else {
          (who->InvSel).field_0 = (who->super_AActor).Inventory.field_0;
        }
      }
      else {
        TObjPtr<AInventory>::operator=(&who->InvSel,pAVar3);
        pAVar4 = pAVar3;
      }
      uVar2 = FIntCVar::operator_cast_to_int(&displaynametags);
      if (((((uVar2 & 1) != 0) && (StatusBar != (DBaseStatusBar *)0x0)) &&
          (SmallFont != (FFont *)0x0)) &&
         (pAVar3 = TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&who->InvSel), this = StatusBar,
         pAVar3 != (AInventory *)0x0)) {
        this_00 = (DHUDMessageFadeOut *)DObject::operator_new((DObject *)0xc8,(size_t)pAVar4);
        font = SmallFont;
        pAVar4 = TObjPtr<AInventory>::operator->(&who->InvSel);
        text = AActor::GetTag(&pAVar4->super_AActor,(char *)0x0);
        textColor = FIntCVar::operator*(&nametagcolor);
        DHUDMessageFadeOut::DHUDMessageFadeOut(this_00,font,text,1.5,0.8,0,0,textColor,2.0,0.35);
        DBaseStatusBar::AttachMessage(this,(DHUDMessage *)this_00,0x564e4953,0);
      }
    }
    ((who->super_AActor).player)->inventorytics = 0xaf;
  }
  return;
}

Assistant:

CCMD (invnext)
{
	AInventory *next;

	if (who == NULL)
		return;

	if (who->InvSel != NULL)
	{
		if ((next = who->InvSel->NextInv()) != NULL)
		{
			who->InvSel = next;
		}
		else
		{
			// Select the first item in the inventory
			if (!(who->Inventory->ItemFlags & IF_INVBAR))
			{
				who->InvSel = who->Inventory->NextInv();
			}
			else
			{
				who->InvSel = who->Inventory;
			}
		}
		if ((displaynametags & 1) && StatusBar && SmallFont && who->InvSel)
			StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, who->InvSel->GetTag(), 
			1.5f, 0.80f, 0, 0, (EColorRange)*nametagcolor, 2.f, 0.35f), MAKE_ID('S','I','N','V'));
	}
	who->player->inventorytics = 5*TICRATE;
}